

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimeParser::DateTimeParser(DateTimeParser *this,Type t)

{
  QLatin1String local_40;
  QString local_30;
  Type local_14;
  DateTimeParser *pDStack_10;
  Type t_local;
  DateTimeParser *this_local;
  
  this->_vptr_DateTimeParser = (_func_int **)&PTR__DateTimeParser_00244c10;
  local_14 = t;
  pDStack_10 = this;
  QList<QtMWidgets::Section>::QList(&this->sections);
  this->type = local_14;
  QString::QString(&this->format);
  QLatin1String::QLatin1String(&local_40,"dddd MMMM yyyy hh mm");
  QString::QString(&local_30,local_40);
  parseFormat(this,&local_30);
  QString::~QString(&local_30);
  return;
}

Assistant:

DateTimeParser::DateTimeParser( QMetaType::Type t )
	:	type( t )
{
	parseFormat( QLatin1String( "dddd MMMM yyyy hh mm" ) );
}